

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_integer_constant_expression
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 local_20 [16];
  
  paVar1 = &(__return_storage_ptr__->m_reason).field_2;
  if (this->m_glslVersion == GLSL_VERSION_310_ES) {
    local_20[0] = 0;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = true;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_20,local_20);
  }
  else {
    local_20[0] = 0;
    __return_storage_ptr__->m_passed = true;
    __return_storage_ptr__->m_notRunForThisContext = true;
    (__return_storage_ptr__->m_reason)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_reason,local_20,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_integer_constant_expression()
{
	bool passed = true;
	if (getGLSLVersion() == glu::GLSL_VERSION_310_ES)
		return LayoutBindingTestResult(passed, String(), true);

	return LayoutBindingTestResult(passed, String(), true);
}